

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

ObjectPtr<tvm::runtime::LibraryModuleNode> __thiscall
tvm::runtime::ObjAllocatorBase<tvm::runtime::SimpleObjAllocator>::
make_object<tvm::runtime::LibraryModuleNode,tvm::runtime::ObjectPtr<tvm::runtime::Library>&>
          (ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this,
          ObjectPtr<tvm::runtime::Library> *args)

{
  uint32_t uVar1;
  LibraryModuleNode *pLVar2;
  FDeleter p_Var3;
  ObjectPtr<tvm::runtime::Library> *in_RDX;
  Object *local_30;
  LibraryModuleNode *ptr;
  ObjectPtr<tvm::runtime::Library> *args_local;
  ObjAllocatorBase<tvm::runtime::SimpleObjAllocator> *this_local;
  
  pLVar2 = SimpleObjAllocator::Handler<tvm::runtime::LibraryModuleNode>::
           New<tvm::runtime::ObjectPtr<tvm::runtime::Library>&>((SimpleObjAllocator *)args,in_RDX);
  uVar1 = ModuleNode::RuntimeTypeIndex();
  (pLVar2->super_ModuleNode).super_Object.type_index_ = uVar1;
  p_Var3 = SimpleObjAllocator::Handler<tvm::runtime::LibraryModuleNode>::Deleter();
  (pLVar2->super_ModuleNode).super_Object.deleter_ = p_Var3;
  local_30 = (Object *)0x0;
  if (pLVar2 != (LibraryModuleNode *)0x0) {
    local_30 = &(pLVar2->super_ModuleNode).super_Object;
  }
  ObjectPtr<tvm::runtime::LibraryModuleNode>::ObjectPtr
            ((ObjectPtr<tvm::runtime::LibraryModuleNode> *)this,local_30);
  return (ObjectPtr<tvm::runtime::LibraryModuleNode>)(Object *)this;
}

Assistant:

inline ObjectPtr<T> make_object(Args&&... args) {
    using Handler = typename Derived::template Handler<T>;
    static_assert(std::is_base_of<Object, T>::value,
                  "make can only be used to create Object");
    T* ptr = Handler::New(static_cast<Derived*>(this),
                         std::forward<Args>(args)...);
    ptr->type_index_ = T::RuntimeTypeIndex();
    ptr->deleter_ = Handler::Deleter();
    return ObjectPtr<T>(ptr);
  }